

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

bool __thiscall
iDynTree::Model::getInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  VectorDynSize *vec;
  size_t sVar1;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
  *pBVar2;
  const_reference this_00;
  ulong in_RSI;
  long in_RDI;
  Vector10 inertiaParamsBuf;
  LinkIndex linkIdx;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff08;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
  *this_01;
  ulong in_stack_ffffffffffffff18;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
  *local_18;
  
  vec = (VectorDynSize *)iDynTree::VectorDynSize::size();
  sVar1 = getNrOfLinks((Model *)0x44b7d0);
  if (vec != (VectorDynSize *)(sVar1 * 10)) {
    getNrOfLinks((Model *)0x44b7f8);
    iDynTree::VectorDynSize::resize(in_RSI);
    in_stack_ffffffffffffff18 = in_RSI;
  }
  local_18 = (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
              *)0x0;
  while( true ) {
    this_01 = local_18;
    pBVar2 = (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
              *)getNrOfLinks((Model *)0x44b829);
    if (pBVar2 <= this_01) break;
    this_00 = std::vector<iDynTree::Link,_std::allocator<iDynTree::Link>_>::operator[]
                        ((vector<iDynTree::Link,_std::allocator<iDynTree::Link>_> *)(in_RDI + 8),
                         (size_type)local_18);
    Link::inertia(this_00);
    iDynTree::SpatialInertia::asVector();
    toEigen<10U>((VectorFixSize<10U> *)vec);
    toEigen(vec);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    segment<10>((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)vec,in_RDI,in_stack_ffffffffffffff18);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,10,1,false>::
    operator=(this_01,in_stack_ffffffffffffff08);
    local_18 = (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
                *)((long)&(local_18->
                          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>,_0>
                          .m_data + 1);
  }
  return true;
}

Assistant:

bool Model::getInertialParameters(VectorDynSize& modelInertialParams) const
{
    // Resize vector if necessary
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        modelInertialParams.resize(10*this->getNrOfLinks());
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf = links[linkIdx].inertia().asVector();

        toEigen(modelInertialParams).segment<10>(10*linkIdx) = toEigen(inertiaParamsBuf);
    }

    return true;
}